

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O2

cio_error stream_read(cio_io_stream *stream,cio_read_buffer *buffer,
                     cio_io_stream_read_handler_t handler,void *handler_context)

{
  cio_error cVar1;
  
  cVar1 = CIO_INVALID_ARGUMENT;
  if (((stream != (cio_io_stream *)0x0) && (buffer != (cio_read_buffer *)0x0)) &&
     (handler != (cio_io_stream_read_handler_t)0x0)) {
    stream[0x3a].read_handler = (cio_io_stream_read_handler_t)stream;
    stream[0x3a].write_some = read_callback;
    stream->read_buffer = buffer;
    stream->read_handler = handler;
    stream->read_handler_context = handler_context;
    cVar1 = CIO_SUCCESS;
  }
  return cVar1;
}

Assistant:

static enum cio_error stream_read(struct cio_io_stream *stream, struct cio_read_buffer *buffer, cio_io_stream_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((stream == NULL) || (buffer == NULL) || (handler == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	struct cio_uart *uart = cio_container_of(stream, struct cio_uart, stream);
	uart->impl.ev.context = stream;
	uart->impl.ev.read_callback = read_callback;
	uart->stream.read_buffer = buffer;
	uart->stream.read_handler = handler;
	uart->stream.read_handler_context = handler_context;

	return CIO_SUCCESS;
}